

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O0

void __thiscall bandit::reporter::xunit::test_run_complete(xunit *this)

{
  ostream *poVar1;
  rep_conflict __val;
  string local_68 [48];
  string local_38;
  duration<double,std::ratio<1l,1l>> local_18 [8];
  duration<double,_std::ratio<1L,_1L>_> dur_in_sec;
  xunit *this_local;
  
  dur_in_sec.__r = (rep_conflict)this;
  std::operator<<(this->stm_,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
  poVar1 = std::operator<<(this->stm_,"<testsuite name=\"bandit\" tests=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_progress_base).specs_run_);
  poVar1 = std::operator<<(poVar1,"\" errors=\"0\" failures=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_progress_base).specs_failed_);
  std::operator<<(poVar1,"\"");
  if (0 < (this->super_progress_base).specs_skipped_) {
    poVar1 = std::operator<<(this->stm_," skipped=\"");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_progress_base).specs_skipped_);
    std::operator<<(poVar1,"\"");
  }
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_18,&this->testsuite_runtime_);
  poVar1 = std::operator<<(this->stm_," time=\"");
  __val = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)local_18);
  std::__cxx11::to_string(&local_38,__val);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\">\n");
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = this->stm_;
  std::__cxx11::stringstream::str();
  std::operator<<(poVar1,local_68);
  std::__cxx11::string::~string(local_68);
  std::operator<<(this->stm_,"</testsuite>\n");
  return;
}

Assistant:

void test_run_complete() override {
        stm_ << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
        stm_ << "<testsuite name=\"bandit\" tests=\"" << specs_run_ << "\" errors=\"0\" failures=\""
             << specs_failed_ << "\"";

        if (specs_skipped_ > 0) {
          stm_ << " skipped=\"" << specs_skipped_ << "\"";
        }

        std::chrono::duration<double> dur_in_sec(testsuite_runtime_);
        stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";

        stm_ << work_stm_.str();

        stm_ << "</testsuite>\n";
      }